

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O2

KindMeta get_kind_meta(Kind kind)

{
  long lVar1;
  CharBuff *buff;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  KindMeta KVar5;
  
  uVar4 = (ulong)kind;
  buff = new_buff(2);
  if (kind < 0x80) {
    append_chr(buff,(char)kind);
    pcVar2 = to_string(buff);
    recycle_buff(buff);
  }
  else {
    pcVar2 = (char *)0x0;
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x360) {
        uVar4 = 0xd1;
        goto LAB_00102cb7;
      }
      lVar1 = lVar3 + 0x10;
    } while (*(Kind *)((long)&kind_table[0].kind + lVar3) != kind);
    pcVar2 = *(char **)((long)&kind_table[0].name + lVar3);
  }
LAB_00102cb7:
  KVar5.name = pcVar2;
  KVar5._0_8_ = uVar4;
  return KVar5;
}

Assistant:

KindMeta get_kind_meta(Kind kind) {
    CharBuff *buff = new_buff(2);
    if (kind != NEWLINE && kind >= 0 && kind <= 127) {
        KindMeta *meta = malloc(sizeof(KindMeta));
        append_chr(buff, (char) kind);
        meta->kind = kind;
        meta->name = to_string(buff);
        recycle_buff(buff);
        return *meta;
    } else {
        for (int i = 0; i < kind_count; ++i) {
            if (kind_table[i].kind == kind) {
                return kind_table[i];
            }
        }
    }
    return EMPTY_KIND;
}